

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_cbc.c
# Opt level: O2

void beltCBCStepD(void *buf,size_t count,void *state)

{
  octet *block;
  long lVar1;
  long lVar2;
  size_t count_00;
  ulong *puVar3;
  
  lVar1 = 0;
  for (lVar2 = 0; block = (octet *)((long)buf + lVar1),
      0x1f < count + lVar2 || count - 0x10 == lVar1; lVar2 = lVar2 + -0x10) {
    *(undefined8 *)((long)state + 0x30) = *(undefined8 *)((long)buf + lVar1);
    *(undefined8 *)((long)state + 0x38) = *(undefined8 *)((long)buf + lVar1 + 8);
    beltBlockDecr(block,(u32 *)state);
    *(ulong *)((long)buf + lVar1) = *(ulong *)((long)buf + lVar1) ^ *(ulong *)((long)state + 0x20);
    puVar3 = (ulong *)((long)buf + lVar1 + 8);
    *puVar3 = *puVar3 ^ *(ulong *)((long)state + 0x28);
    *(undefined8 *)((long)state + 0x20) = *(undefined8 *)((long)state + 0x30);
    *(undefined8 *)((long)state + 0x28) = *(undefined8 *)((long)state + 0x38);
    lVar1 = lVar1 + 0x10;
  }
  if (count - lVar1 != 0) {
    beltBlockDecr(block,(u32 *)state);
    puVar3 = (ulong *)((long)buf + lVar1);
    count_00 = (count - lVar1) - 0x10;
    memSwap(block,puVar3 + 2,count_00);
    memXor2(puVar3 + 2,block,count_00);
    beltBlockDecr(block,(u32 *)state);
    *puVar3 = *puVar3 ^ *(ulong *)((long)state + 0x20);
    puVar3[1] = puVar3[1] ^ *(ulong *)((long)state + 0x28);
  }
  return;
}

Assistant:

void beltCBCStepD(void* buf, size_t count, void* state)
{
	belt_cbc_st* st = (belt_cbc_st*)state;
	ASSERT(count >= 16);
	ASSERT(memIsDisjoint2(buf, count, state, beltCBC_keep()));
	// цикл по полным блокам
	while(count >= 32 || count == 16)
	{
		beltBlockCopy(st->block2, buf);
		beltBlockDecr(buf, st->key);
		beltBlockXor2(buf, st->block);
		beltBlockCopy(st->block, st->block2);
		buf = (octet*)buf + 16;
		count -= 16;
	}
	// неполный блок? кража блока
	if (count)
	{
		ASSERT(16 < count && count < 32);
		beltBlockDecr(buf, st->key);
		memSwap(buf, (octet*)buf + 16, count - 16);
		memXor2((octet*)buf + 16, buf, count - 16);
		beltBlockDecr(buf, st->key);
		beltBlockXor2(buf, st->block);
	}
}